

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
MapEntry<int,_proto2_unittest_import::ImportEnumForMap,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)14>
::~MapEntry(MapEntry<int,_proto2_unittest_import::ImportEnumForMap,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)14>
            *this)

{
  ulong uVar1;
  ulong uVar2;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__MapEntry_0195c5b8;
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar2 = uVar1;
  if ((uVar1 & 1) != 0) {
    uVar2 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (((uVar1 & 1) != 0) && (uVar2 == 0)) {
    InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_);
  }
  return;
}

Assistant:

~MapEntry() PROTOBUF_OVERRIDE {
    // Make sure that `Value` is never a derived message type.
    // We don't want to instantiate the template with every unique derived type.
    // The assertion is in the destructor because we need `Value` to be
    // complete to test it.
    static_assert(!std::is_base_of<Message, Value>::value ||
                      std::is_same<Message, Value>::value,
                  "");

    if (GetArena() != nullptr) return;
    SharedDtor(*this);
  }